

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O3

int __thiscall
libtorrent::aux::bencode_visitor<char_*>::operator()
          (bencode_visitor<char_*> *this,dictionary_type *d)

{
  char **ppcVar1;
  node_ptr pcVar2;
  int iVar3;
  __visit_result_t<libtorrent::aux::bencode_visitor<char_*>_&,_const_std::variant<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>_&>
  _Var4;
  node_ptr pcVar5;
  node_ptr pcVar6;
  int iVar7;
  
  ppcVar1 = this->out;
  **ppcVar1 = 'd';
  *ppcVar1 = *ppcVar1 + 1;
  pcVar6 = *(node_ptr *)
            ((long)&(d->
                    super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                    ).
                    super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                    .m_icont.
                    super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
            + 8);
  iVar7 = 2;
  while( true ) {
    if (pcVar6 == (node_ptr)
                  &(d->
                   super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                   ).
                   super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                   .m_icont.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
       ) {
      ppcVar1 = this->out;
      **ppcVar1 = 'e';
      *ppcVar1 = *ppcVar1 + 1;
      return iVar7;
    }
    if (pcVar6 == (node_ptr)0x0) break;
    iVar3 = write_integer<char*,unsigned_long,void>(this->out,(unsigned_long)pcVar6[1].left_);
    ppcVar1 = this->out;
    **ppcVar1 = ':';
    *ppcVar1 = *ppcVar1 + 1;
    ppcVar1 = this->out;
    memcpy(*ppcVar1,pcVar6[1].parent_,(size_t)pcVar6[1].left_);
    pcVar2 = pcVar6[1].left_;
    *ppcVar1 = *ppcVar1 + (long)pcVar2;
    _Var4 = ::std::
            visit<libtorrent::aux::bencode_visitor<char*>&,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
                      (this,(variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                             *)&pcVar6[2].left_);
    pcVar5 = pcVar6->right_;
    if (pcVar6->right_ == (node_ptr)0x0) {
      do {
        pcVar5 = pcVar6;
        pcVar6 = (node_ptr)((ulong)pcVar5->parent_ & 0xfffffffffffffffe);
      } while (pcVar5 == pcVar6->right_);
      if (pcVar5->right_ == pcVar6) {
        pcVar6 = pcVar5;
      }
    }
    else {
      do {
        pcVar6 = pcVar5;
        pcVar5 = pcVar6->left_;
      } while (pcVar6->left_ != (node_ptr)0x0);
    }
    iVar7 = iVar7 + (int)pcVar2 + iVar3 + _Var4 + 1;
  }
  __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
               );
}

Assistant:

int operator()(entry::dictionary_type const& d)
		{
			write_char(out, 'd');
			int ret = 2;
			for (auto const& i : d)
			{
				// write key
				ret += write_integer(out, i.first.length());
				write_char(out, ':');
				ret += write_string(i.first, out);
				// write value
				ret += std::visit(*this, static_cast<entry::variant_type const&>(i.second));
				ret += 1;
			}
			write_char(out, 'e');
			return ret;
		}